

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O3

int inflateReset(z_streamp strm)

{
  internal_state *piVar1;
  int iVar2;
  
  iVar2 = inflateStateCheck(strm);
  if (iVar2 != 0) {
    return -2;
  }
  piVar1 = strm->state;
  *(undefined8 *)((long)&piVar1->gzhead + 4) = 0;
  *(undefined4 *)((long)&piVar1->gzindex + 4) = 0;
  iVar2 = inflateResetKeep(strm);
  return iVar2;
}

Assistant:

int ZEXPORT inflateReset(strm)
z_streamp strm;
{
    struct inflate_state FAR *state;

    if (inflateStateCheck(strm)) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    state->wsize = 0;
    state->whave = 0;
    state->wnext = 0;
    return inflateResetKeep(strm);
}